

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DGXMLScanner::scanContent(DGXMLScanner *this)

{
  XMLCh XVar1;
  XMLTokens XVar2;
  StackElem *pSVar3;
  XMLCh *text1;
  bool gotData;
  XMLSize_t orgReader;
  bool local_49 [9];
  ElemStack *local_40;
  XMLSize_t local_38;
  
  local_49[0] = true;
  local_40 = &(this->super_XMLScanner).fElemStack;
  do {
    if (local_49[0] == true) {
      do {
        XVar2 = XMLScanner::senseNextToken(&this->super_XMLScanner,&local_38);
        switch(XVar2) {
        case Token_CData:
          if ((this->super_XMLScanner).fElemStack.fStackTop == 0) {
            XMLScanner::emitError(&this->super_XMLScanner,CDATAOutsideOfContent);
          }
          (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xb])
                    (this);
          break;
        case Token_CharData:
          (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xc])
                    (this,&(this->super_XMLScanner).fCDataBuf);
          goto LAB_0029d6b9;
        case Token_Comment:
          XMLScanner::scanComment(&this->super_XMLScanner);
          break;
        case Token_EndTag:
          scanEndTag(this,local_49);
          break;
        case Token_EOF:
          if ((this->super_XMLScanner).fElemStack.fStackTop != 0) {
            pSVar3 = ElemStack::popTop(local_40);
            text1 = QName::getRawName(pSVar3->fThisElement->fElementName);
            XMLScanner::emitError
                      (&this->super_XMLScanner,EndedWithTagsOnStack,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
          local_49[0] = false;
          goto LAB_0029d6b9;
        case Token_PI:
          XMLScanner::scanPI(&this->super_XMLScanner);
          break;
        case Token_StartTag:
          if ((this->super_XMLScanner).fDoNamespaces == true) {
            scanStartTagNS(this,local_49);
          }
          else {
            scanStartTag(this,local_49);
          }
          break;
        default:
          do {
            XVar1 = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
            if (XVar1 == L'<') break;
          } while (XVar1 != L'\0');
        }
        if (local_38 != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
          XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
        }
LAB_0029d6b9:
      } while (local_49[0] != false);
    }
    if (local_49[0] == false) {
      return true;
    }
  } while( true );
}

Assistant:

bool DGXMLScanner::scanContent()
{
    //  Go into a loop until we hit the end of the root element, or we fall
    //  out because there is no root element.
    //
    //  We have to do kind of a deeply nested double loop here in order to
    //  avoid doing the setup/teardown of the exception handler on each
    //  round. Doing it this way we only do it when an exception actually
    //  occurs.
    bool gotData = true;
    bool inMarkup = false;
    while (gotData)
    {
        try
        {
            while (gotData)
            {
                //  Sense what the next top level token is. According to what
                //  this tells us, we will call something to handle that kind
                //  of thing.
                XMLSize_t orgReader;
                const XMLTokens curToken = senseNextToken(orgReader);

                //  Handle character data and end of file specially. Char data
                //  is not markup so we don't want to handle it in the loop
                //  below.
                if (curToken == Token_CharData)
                {
                    //  Scan the character data and call appropriate events. Let
                    //  him use our local character data buffer for efficiency.
                    scanCharData(fCDataBuf);
                    continue;
                }
                else if (curToken == Token_EOF)
                {
                    //  The element stack better be empty at this point or we
                    //  ended prematurely before all elements were closed.
                    if (!fElemStack.isEmpty())
                    {
                        const ElemStack::StackElem* topElem = fElemStack.popTop();
                        emitError
                        (
                            XMLErrs::EndedWithTagsOnStack
                            , topElem->fThisElement->getFullName()
                        );
                    }

                    // Its the end of file, so clear the got data flag
                    gotData = false;
                    continue;
                }

                // We are in some sort of markup now
                inMarkup = true;

                //  According to the token we got, call the appropriate
                //  scanning method.
                switch(curToken)
                {
                    case Token_CData :
                        // Make sure we are within content
                        if (fElemStack.isEmpty())
                            emitError(XMLErrs::CDATAOutsideOfContent);
                        scanCDSection();
                        break;

                    case Token_Comment :
                        scanComment();
                        break;

                    case Token_EndTag :
                        scanEndTag(gotData);
                        break;

                    case Token_PI :
                        scanPI();
                        break;

                    case Token_StartTag :
                        if (fDoNamespaces)
                            scanStartTagNS(gotData);
                        else
                            scanStartTag(gotData);
                        break;

                    default :
                        fReaderMgr.skipToChar(chOpenAngle);
                        break;
                }

                if (orgReader != fReaderMgr.getCurrentReaderNum())
                    emitError(XMLErrs::PartialMarkupInEntity);

                // And we are back out of markup again
                inMarkup = false;
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  If we were in some markup when this happened, then its a
            //  partial markup error.
            if (inMarkup)
                emitError(XMLErrs::PartialMarkupInEntity);

            // Send an end of entity reference event
            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());

            inMarkup = false;
        }
    }

    // It went ok, so return success
    return true;
}